

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

void __thiscall
SpikesConsumer_python::SpikesConsumer_python
          (SpikesConsumer_python *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs
          ,int np)

{
  HFParsingInfo *pHVar1;
  pointer pbVar2;
  HFParsingInfo *in_RCX;
  undefined4 in_EDX;
  HFParsingInfo *in_RDI;
  HighFreqDataType *in_stack_fffffffffffffeb0;
  numpy *this_00;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  object_base in_stack_fffffffffffffee0;
  tuple local_110 [16];
  int in_stack_ffffffffffffff74;
  HFParsingInfo *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  HighFreqDataType *in_stack_ffffffffffffff88;
  SpikesConsumer *in_stack_ffffffffffffff90;
  
  HighFreqDataType::HighFreqDataType
            ((HighFreqDataType *)in_stack_fffffffffffffee0.m_ptr,
             (HighFreqDataType *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  HFParsingInfo::HFParsingInfo(in_RCX,in_RDI);
  SpikesConsumer::SpikesConsumer
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  HFParsingInfo::~HFParsingInfo((HFParsingInfo *)in_stack_fffffffffffffeb0);
  HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffffeb0);
  boost::python::wrapper<SpikesConsumer>::wrapper((wrapper<SpikesConsumer> *)0x39b586);
  (in_RDI->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__SpikesConsumer_python_005d6800;
  pHVar1 = in_RDI + 0x10;
  pbVar2 = (pointer)operator_new(0x28);
  spikePacket::spikePacket((spikePacket *)0x39b5c1);
  (pHVar1->dataRequested).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
  this_00 = (numpy *)&in_RDI[0x10].dataRequested.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  boost::python::make_tuple<int>((int *)CONCAT44(in_EDX,in_stack_fffffffffffffed8));
  boost::python::numpy::dtype::get_builtin<short>();
  boost::python::numpy::empty(this_00,local_110,(dtype *)&stack0xfffffffffffffee0);
  boost::python::numpy::dtype::~dtype((dtype *)0x39b623);
  boost::python::tuple::~tuple((tuple *)0x39b62d);
  *(undefined4 *)
   in_RDI[0x10].dataRequested.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   &(in_RDI[0x10].dataRequested.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = 0;
  *(undefined4 *)
   &(in_RDI[0x10].dataRequested.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length = 0;
  std::vector<int2d,_std::allocator<int2d>_>::reserve
            ((vector<int2d,_std::allocator<int2d>_> *)in_stack_fffffffffffffee0.m_ptr,
             CONCAT44(in_EDX,in_stack_fffffffffffffed8));
  return;
}

Assistant:

SpikesConsumer_python(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs, int np)
        : SpikesConsumer(hf, ringbufsize, parseargs, np),
          data(new spikePacket),
          spikearray(np::empty(boost::python::make_tuple(1), np::dtype::get_builtin<int16_t>()))
    {
        data->ntrodeid=0;
        data->cluster=0;
        data->timestamp=0;
        data->points.reserve(np);
    }